

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall GlobOptBlockData::TrackArgumentsSym(GlobOptBlockData *this,RegOpnd *opnd)

{
  uint uVar1;
  JitArenaAllocator *pJVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  JITTimeFunctionBody *pJVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  char16 *pcVar8;
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  wchar local_88 [4];
  char16 debugStringBuffer2 [42];
  
  this_00 = this->curFunc->argObjSyms;
  if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3d6ef4);
    pJVar2 = this->globOpt->alloc;
    this_00->head = (Type_conflict)0x0;
    this_00->lastFoundIndex = (Type_conflict)0x0;
    this_00->alloc = pJVar2;
    this_00->lastUsedNodePrevNextField = (Type)this_00;
    this->curFunc->argObjSyms = this_00;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,(opnd->m_sym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set(this->argObjSyms,(opnd->m_sym->super_Sym).m_id);
  sourceContextId = Func::GetSourceContextId(this->globOpt->func);
  functionId = Func::GetLocalFunctionId(this->globOpt->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar3) {
    uVar1 = (opnd->m_sym->super_Sym).m_id;
    pJVar4 = Func::GetJITFunctionBody(this->curFunc);
    pcVar5 = JITTimeFunctionBody::GetDisplayName(pJVar4);
    pcVar6 = Func::GetDebugNumberSet(this->curFunc,(wchar (*) [42])local_e8);
    pJVar4 = Func::GetJITFunctionBody(this->globOpt->func);
    pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar4);
    pcVar8 = Func::GetDebugNumberSet(this->globOpt->func,(wchar (*) [42])local_88);
    Output::Print(L"Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"
                  ,(ulong)uVar1,pcVar5,pcVar6,pcVar7,pcVar8);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOptBlockData::TrackArgumentsSym(IR::RegOpnd const* opnd)
{
    if(!this->curFunc->argObjSyms)
    {
        this->curFunc->argObjSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }
    this->curFunc->argObjSyms->Set(opnd->m_sym->m_id);
    this->argObjSyms->Set(opnd->m_sym->m_id);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->globOpt->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"),
            opnd->m_sym->m_id,
            this->curFunc->GetJITFunctionBody()->GetDisplayName(),
            this->curFunc->GetDebugNumberSet(debugStringBuffer),
            this->globOpt->func->GetJITFunctionBody()->GetDisplayName(),
            this->globOpt->func->GetDebugNumberSet(debugStringBuffer2)
            );
        Output::Flush();
    }
#endif
}